

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCuSu.cpp
# Opt level: O0

void __thiscall
NaPNCuSum::setup(NaPNCuSum *this,NaReal sigma0,NaReal sigma1,NaReal h_sol,NaReal k_const)

{
  NaReal k_const_local;
  NaReal h_sol_local;
  NaReal sigma1_local;
  NaReal sigma0_local;
  NaPNCuSum *this_local;
  
  this->fSigma[0] = sigma0;
  this->fSigma[1] = sigma1;
  this->fK = k_const;
  this->fTopVal = h_sol;
  this->fS = 0.0;
  this->fStartTime = 0.0;
  this->fPrevTA = -1.0;
  return;
}

Assistant:

void
NaPNCuSum::setup (NaReal sigma0, NaReal sigma1,
		  NaReal h_sol, NaReal k_const)
{
  fSigma[0] = sigma0;
  fSigma[1] = sigma1;
  fK = k_const;
  fTopVal = h_sol;
  fS = 0.0;
  fStartTime = 0.0;
  fPrevTA = -1.0;
}